

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.hpp
# Opt level: O0

bool __thiscall
OpenMD::MoleculeStamp::
addIndexSensitiveStamp<std::vector<OpenMD::FragmentStamp*,std::allocator<OpenMD::FragmentStamp*>>,OpenMD::FragmentStamp>
          (MoleculeStamp *this,
          vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_> *cont,
          FragmentStamp *stamp)

{
  uint uVar1;
  const_iterator __position;
  reference ppFVar2;
  iterator __n;
  FragmentStamp *in_RDX;
  vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_> *in_RSI;
  size_t size;
  bool ret;
  uint index;
  vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>
  *in_stack_ffffffffffffff98;
  vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_> *this_00;
  vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>
  *in_stack_ffffffffffffffd0;
  undefined1 local_1d;
  
  uVar1 = FragmentStamp::getIndex(in_RDX);
  __position._M_current =
       (FragmentStamp **)
       std::vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>::size(in_RSI);
  if (__position._M_current < (FragmentStamp **)(ulong)(uVar1 + 1)) {
    this_00 = in_RSI;
    __n = std::vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>::end
                    (in_stack_ffffffffffffff98);
    __gnu_cxx::
    __normal_iterator<OpenMD::FragmentStamp*const*,std::vector<OpenMD::FragmentStamp*,std::allocator<OpenMD::FragmentStamp*>>>
    ::__normal_iterator<OpenMD::FragmentStamp**>
              ((__normal_iterator<OpenMD::FragmentStamp_*const_*,_std::vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>_>
                *)this_00,
               (__normal_iterator<OpenMD::FragmentStamp_**,_std::vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>_>
                *)in_stack_ffffffffffffff98);
    std::vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>::size(in_RSI);
    std::vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>::insert
              (in_stack_ffffffffffffffd0,__position,(size_type)__n._M_current,(value_type *)0x0);
    ppFVar2 = std::vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>::
              operator[](in_RSI,(ulong)uVar1);
    *ppFVar2 = in_RDX;
    local_1d = true;
  }
  else {
    ppFVar2 = std::vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>::
              operator[](in_RSI,(ulong)uVar1);
    local_1d = *ppFVar2 == (value_type)0x0;
    if (local_1d) {
      ppFVar2 = std::vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>::
                operator[](in_RSI,(ulong)uVar1);
      *ppFVar2 = in_RDX;
    }
  }
  return local_1d;
}

Assistant:

bool addIndexSensitiveStamp(Cont& cont, T* stamp) {
      // typename Cont::iterator i;
      unsigned int index = stamp->getIndex();
      bool ret           = false;
      size_t size        = cont.size();

      if (size >= index + 1) {
        if (cont[index] != NULL) {
          ret = false;
        } else {
          cont[index] = stamp;
          ret         = true;
        }
      } else {
        cont.insert(cont.end(), index - cont.size() + 1, NULL);
        cont[index] = stamp;
        ret         = true;
      }

      return ret;
    }